

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void dynamic_suite::test_number(void)

{
  undefined4 local_10c;
  type_conflict8 local_108;
  undefined1 local_103;
  undefined1 local_102 [10];
  char *msg;
  undefined1 local_e8 [8];
  variable value;
  undefined1 local_b0 [8];
  iarchive in;
  value_type input [5];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_1_ = 0x3f;
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ = 0x800000c5;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[5]>
            ((iarchive *)local_b0,
             (uchar (*) [5])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x48));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_e8);
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)local_b0,
             (basic_variable<std::allocator<char>_> *)local_e8);
  local_102[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>
                           ((basic_variable<std::allocator<char>_> *)local_e8);
  local_103 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("value.is<real>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x3b6,"void dynamic_suite::test_number()",local_102,&local_103);
  local_108 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                        ((basic_variable<std::allocator<char>_> *)local_e8);
  local_10c = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("value.value<float>()","1.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x3b7,"void dynamic_suite::test_number()",&local_108,&local_10c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_e8);
  trial::protocol::bintoken::iarchive::~iarchive((iarchive *)local_b0);
  return;
}

Assistant:

void test_number()
{
    const value_type input[] = { bintoken::token::code::float32, 0x00, 0x00, 0x80, 0x3F };
    format::iarchive in(input);
    variable value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value.is<real>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(value.value<float>(), 1.0f);
}